

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

bool __thiscall
VulkanHppGenerator::checkEquivalentSingularConstructor
          (VulkanHppGenerator *this,
          vector<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_>_>
          *constructorIts,const_iterator constructorIt,const_iterator lenIt)

{
  pointer p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  long lVar5;
  int iVar6;
  long lVar7;
  pointer p_Var8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  _Base_ptr *pp_Var12;
  bool bVar13;
  
  p_Var8 = (constructorIts->
           super__Vector_base<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  p_Var1 = (constructorIts->
           super__Vector_base<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar13 = p_Var8 != p_Var1;
  if (bVar13) {
    p_Var2 = constructorIt._M_node[5]._M_parent;
    uVar9 = ((long)constructorIt._M_node[5]._M_left - (long)p_Var2 >> 3) * 0xf83e0f83e0f83e1;
    bVar13 = true;
    do {
      p_Var3 = p_Var8->_M_node[5]._M_parent;
      p_Var4 = p_Var8->_M_node[5]._M_left;
      lVar7 = ((long)p_Var4 - (long)p_Var3 >> 3) * 0xf83e0f83e0f83e1;
      if (lVar7 + 1U == uVar9) {
        if (p_Var4 == p_Var3) {
          return bVar13;
        }
        lVar7 = lVar7 + (ulong)(lVar7 == 0);
        pp_Var12 = &p_Var3[1]._M_parent;
        uVar11 = 0;
        while( true ) {
          if (uVar9 <= uVar11) {
            __assert_fail("j < constructorIt->second.params.size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                          ,0x3b5,
                          "auto VulkanHppGenerator::checkEquivalentSingularConstructor(const std::vector<std::map<std::string, CommandData>::const_iterator> &, std::map<std::string, CommandData>::const_iterator, std::vector<ParamData>::const_iterator)::(anonymous class)::operator()(std::map<std::string, CommandData>::const_iterator) const"
                         );
          }
          lVar10 = (uVar11 == ((long)lenIt._M_current - (long)p_Var2 >> 3) * 0xf83e0f83e0f83e1) +
                   uVar11;
          lVar5 = lVar10 * 0x108;
          p_Var3 = *pp_Var12;
          if ((p_Var3 != *(_Base_ptr *)((long)p_Var2 + lVar5 + 0x28)) ||
             ((p_Var3 != (_Base_ptr)0x0 &&
              (iVar6 = bcmp(*(void **)(pp_Var12 + -1),*(void **)((long)p_Var2 + lVar5 + 0x20),
                            (size_t)p_Var3), iVar6 != 0)))) break;
          uVar11 = lVar10 + 1;
          pp_Var12 = pp_Var12 + 0x21;
          lVar7 = lVar7 + -1;
          if (lVar7 == 0) {
            return bVar13;
          }
        }
      }
      p_Var8 = p_Var8 + 1;
      bVar13 = p_Var8 != p_Var1;
    } while (bVar13);
  }
  return bVar13;
}

Assistant:

bool VulkanHppGenerator::checkEquivalentSingularConstructor( std::vector<std::map<std::string, CommandData>::const_iterator> const & constructorIts,
                                                             std::map<std::string, CommandData>::const_iterator                      constructorIt,
                                                             std::vector<ParamData>::const_iterator                                  lenIt ) const
{
  // check, if there is no singular constructor with the very same arguments as this array constructor
  // (besides the size, of course)
  auto isEquivalentSingularConstructor = [constructorIt, lenIt]( std::map<std::string, CommandData>::const_iterator it )
  {
    if ( it->second.params.size() + 1 != constructorIt->second.params.size() )
    {
      return false;
    }
    const size_t lenIdx = std::distance( constructorIt->second.params.begin(), lenIt );
    for ( size_t i = 0, j = 0; i < it->second.params.size(); ++i, ++j )
    {
      assert( j < constructorIt->second.params.size() );
      if ( j == lenIdx )
      {
        ++j;
      }
      if ( it->second.params[i].type.type != constructorIt->second.params[j].type.type )
      {
        return false;
      }
    }
    return true;
  };
  return ( std::ranges::any_of( constructorIts, isEquivalentSingularConstructor ) );
}